

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall cmFileInstaller::GetTargetTypeFromString(cmFileInstaller *this,string *stype)

{
  cmCommand *this_00;
  int iVar1;
  ostream *poVar2;
  ostringstream e;
  string local_1b0;
  undefined1 local_190 [376];
  
  iVar1 = std::__cxx11::string::compare((char *)stype);
  if (iVar1 == 0) {
    *(undefined4 *)&(this->super_cmFileCopier).field_0xc4 = 0;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)stype);
    if (iVar1 == 0) {
      *(undefined4 *)&(this->super_cmFileCopier).field_0xc4 = 4;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)stype);
      if (iVar1 == 0) {
        *(undefined4 *)&(this->super_cmFileCopier).field_0xc4 = 5;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)stype);
        if (iVar1 == 0) {
          *(undefined4 *)&(this->super_cmFileCopier).field_0xc4 = 1;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)stype);
          if (iVar1 == 0) {
            *(undefined4 *)&(this->super_cmFileCopier).field_0xc4 = 2;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)stype);
            if (iVar1 == 0) {
              *(undefined4 *)&(this->super_cmFileCopier).field_0xc4 = 3;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)stype);
              if (iVar1 != 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_190,"Option TYPE given unknown value \"",0x21);
                poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_190,(stype->_M_dataplus)._M_p,
                                    stype->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\".",2);
                this_00 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(this_00,&local_1b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                  operator_delete(local_1b0._M_dataplus._M_p,
                                  local_1b0.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
                std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
                return false;
              }
              *(undefined4 *)&(this->super_cmFileCopier).field_0xc4 = 6;
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool cmFileInstaller::GetTargetTypeFromString(const std::string& stype)
{
  if (stype == "EXECUTABLE") {
    this->InstallType = cmInstallType_EXECUTABLE;
  } else if (stype == "FILE") {
    this->InstallType = cmInstallType_FILES;
  } else if (stype == "PROGRAM") {
    this->InstallType = cmInstallType_PROGRAMS;
  } else if (stype == "STATIC_LIBRARY") {
    this->InstallType = cmInstallType_STATIC_LIBRARY;
  } else if (stype == "SHARED_LIBRARY") {
    this->InstallType = cmInstallType_SHARED_LIBRARY;
  } else if (stype == "MODULE") {
    this->InstallType = cmInstallType_MODULE_LIBRARY;
  } else if (stype == "DIRECTORY") {
    this->InstallType = cmInstallType_DIRECTORY;
  } else {
    std::ostringstream e;
    e << "Option TYPE given unknown value \"" << stype << "\".";
    this->FileCommand->SetError(e.str());
    return false;
  }
  return true;
}